

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_sparse.cpp
# Opt level: O2

double * __thiscall Disa::Matrix_Sparse::at(Matrix_Sparse *this,size_t *i_row,size_t *i_column)

{
  long lVar1;
  ostream *poVar2;
  source_location *location;
  iterator_element *this_00;
  string local_190;
  string local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  iterator_element local_f0;
  iterator_element iter;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string local_70;
  string local_50;
  undefined **local_30;
  
  location = (source_location *)
             (this->row_non_zero).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
  lVar1 = (long)(this->row_non_zero).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)location;
  if ((lVar1 == 0) || ((lVar1 >> 3) - 1U <= *i_row)) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"\n");
    local_b0._M_dataplus._M_p = (pointer)&PTR_s__workspace_llm4binary_github_lic_00150ca0;
    console_format_abi_cxx11_
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&iter,
               (Disa *)0x0,(Log_Level)&local_b0,location);
    poVar2 = std::operator<<(poVar2,(string *)&iter);
    std::__cxx11::to_string(&local_170,*i_row);
    std::operator+(&local_150,"Row index ",&local_170);
    std::operator+(&local_130,&local_150," not in range ");
    range_row_abi_cxx11_(&local_190,this);
    std::operator+(&local_110,&local_130,&local_190);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f0,
                   &local_110,".");
    poVar2 = std::operator<<(poVar2,(string *)&local_f0);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  else {
    if (*i_column < this->column_size) {
      lower_bound(&iter,this,i_row,i_column);
      if (*i_column == *iter.column_index) {
        return iter.value;
      }
      poVar2 = std::operator<<((ostream *)&std::cerr,"\n");
      local_30 = &PTR_s__workspace_llm4binary_github_lic_00150cd0;
      console_format_abi_cxx11_
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f0,
                 (Disa *)0x0,(Log_Level)&local_30,(source_location *)iter.column_index);
      poVar2 = std::operator<<(poVar2,(string *)&local_f0);
      std::__cxx11::to_string(&local_50,*i_row);
      std::operator+(&local_b0,"Row, column index ",&local_50);
      std::operator+(&local_190,&local_b0,", ");
      std::__cxx11::to_string(&local_70,*i_column);
      std::operator+(&local_170,&local_190,&local_70);
      std::operator+(&local_150,&local_170,"not in range ");
      range_column_abi_cxx11_(&local_90,this);
      std::operator+(&local_130,&local_150,&local_90);
      std::operator+(&local_110,&local_130,".");
      poVar2 = std::operator<<(poVar2,(string *)&local_110);
      std::endl<char,std::char_traits<char>>(poVar2);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_190);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_50);
      this_00 = &local_f0;
      goto LAB_0012ed04;
    }
    poVar2 = std::operator<<((ostream *)&std::cerr,"\n");
    local_b0._M_dataplus._M_p = (pointer)&PTR_s__workspace_llm4binary_github_lic_00150cb8;
    console_format_abi_cxx11_
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&iter,
               (Disa *)0x0,(Log_Level)&local_b0,location);
    poVar2 = std::operator<<(poVar2,(string *)&iter);
    std::__cxx11::to_string(&local_170,*i_column);
    std::operator+(&local_150,"Column index ",&local_170);
    std::operator+(&local_130,&local_150," not in range ");
    range_column_abi_cxx11_(&local_190,this);
    std::operator+(&local_110,&local_130,&local_190);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f0,
                   &local_110,".");
    poVar2 = std::operator<<(poVar2,(string *)&local_f0);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_170);
  this_00 = &iter;
LAB_0012ed04:
  std::__cxx11::string::~string((string *)this_00);
  exit(1);
}

Assistant:

[[nodiscard]] double& Matrix_Sparse::at(const std::size_t& i_row, const std::size_t& i_column) {
  ASSERT(i_row < size_row(), "Row index " + std::to_string(i_row) + " not in range " + range_row() + ".");
  ASSERT(i_column < size_column(),
         "Column index " + std::to_string(i_column) + " not in range " + range_column() + ".");
  auto iter = lower_bound(i_row, i_column);
  ASSERT(i_column == iter.i_column(), "Row, column index " + std::to_string(i_row) + ", " + std::to_string(i_column) +
                                      "not in range " + range_column() + ".");

  return *iter;
}